

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalCommonGenerator.cxx
# Opt level: O3

void __thiscall cmLocalCommonGenerator::SetConfigName(cmLocalCommonGenerator *this)

{
  cmMakefile *this_00;
  char *pcVar1;
  char *__s;
  string local_40;
  
  this_00 = (this->super_cmLocalGenerator).Makefile;
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"CMAKE_BUILD_TYPE","");
  __s = cmMakefile::GetDefinition(this_00,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  pcVar1 = (char *)(this->ConfigName)._M_string_length;
  if (__s == (char *)0x0) {
    __s = "";
  }
  else {
    strlen(__s);
  }
  std::__cxx11::string::_M_replace((ulong)&this->ConfigName,0,pcVar1,(ulong)__s);
  return;
}

Assistant:

void cmLocalCommonGenerator::SetConfigName()
{
  // Store the configuration name that will be generated.
  if(const char* config = this->Makefile->GetDefinition("CMAKE_BUILD_TYPE"))
    {
    // Use the build type given by the user.
    this->ConfigName = config;
    }
  else
    {
    // No configuration type given.
    this->ConfigName = "";
    }
}